

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Colour::Write(Colour *this,IMkvWriter *writer)

{
  bool bVar1;
  IMkvWriter *writer_00;
  MasteringMetadata *in_RSI;
  Colour *in_RDI;
  uint64_t size;
  Colour *in_stack_ffffffffffffffe0;
  bool local_1;
  
  writer_00 = (IMkvWriter *)PayloadSize(in_stack_ffffffffffffffe0);
  if (writer_00 == (IMkvWriter *)0x0) {
    local_1 = true;
  }
  else {
    bVar1 = Valid(in_RDI);
    if (bVar1) {
      bVar1 = WriteEbmlMasterElement((IMkvWriter *)in_RSI,(uint64)writer_00,(uint64)in_RDI);
      if (bVar1) {
        if ((in_RDI->matrix_coefficients_ != 0xffffffffffffffff) &&
           (bVar1 = WriteEbmlElement(writer_00,(uint64)in_RDI,0x160d0c), !bVar1)) {
          return false;
        }
        if ((in_RDI->bits_per_channel_ != 0xffffffffffffffff) &&
           (bVar1 = WriteEbmlElement(writer_00,(uint64)in_RDI,0x160d3c), !bVar1)) {
          return false;
        }
        if ((in_RDI->chroma_subsampling_horz_ != 0xffffffffffffffff) &&
           (bVar1 = WriteEbmlElement(writer_00,(uint64)in_RDI,0x160d6c), !bVar1)) {
          return false;
        }
        if ((in_RDI->chroma_subsampling_vert_ != 0xffffffffffffffff) &&
           (bVar1 = WriteEbmlElement(writer_00,(uint64)in_RDI,0x160d9c), !bVar1)) {
          return false;
        }
        if ((in_RDI->cb_subsampling_horz_ != 0xffffffffffffffff) &&
           (bVar1 = WriteEbmlElement(writer_00,(uint64)in_RDI,0x160dcc), !bVar1)) {
          return false;
        }
        if ((in_RDI->cb_subsampling_vert_ != 0xffffffffffffffff) &&
           (bVar1 = WriteEbmlElement(writer_00,(uint64)in_RDI,0x160dfc), !bVar1)) {
          return false;
        }
        if ((in_RDI->chroma_siting_horz_ != 0xffffffffffffffff) &&
           (bVar1 = WriteEbmlElement(writer_00,(uint64)in_RDI,0x160e2c), !bVar1)) {
          return false;
        }
        if ((in_RDI->chroma_siting_vert_ != 0xffffffffffffffff) &&
           (bVar1 = WriteEbmlElement(writer_00,(uint64)in_RDI,0x160e5c), !bVar1)) {
          return false;
        }
        if ((in_RDI->range_ != 0xffffffffffffffff) &&
           (bVar1 = WriteEbmlElement(writer_00,(uint64)in_RDI,0x160e8c), !bVar1)) {
          return false;
        }
        if ((in_RDI->transfer_characteristics_ != 0xffffffffffffffff) &&
           (bVar1 = WriteEbmlElement(writer_00,(uint64)in_RDI,0x160ebc), !bVar1)) {
          return false;
        }
        if ((in_RDI->primaries_ != 0xffffffffffffffff) &&
           (bVar1 = WriteEbmlElement(writer_00,(uint64)in_RDI,0x160eec), !bVar1)) {
          return false;
        }
        if ((in_RDI->max_cll_ != 0xffffffffffffffff) &&
           (bVar1 = WriteEbmlElement(writer_00,(uint64)in_RDI,0x160f1c), !bVar1)) {
          return false;
        }
        if ((in_RDI->max_fall_ != 0xffffffffffffffff) &&
           (bVar1 = WriteEbmlElement(writer_00,(uint64)in_RDI,0x160f49), !bVar1)) {
          return false;
        }
        if ((in_RDI->mastering_metadata_ != (MasteringMetadata *)0x0) &&
           (bVar1 = MasteringMetadata::Write(in_RSI,writer_00), !bVar1)) {
          return false;
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Colour::Write(IMkvWriter* writer) const {
  const uint64_t size = PayloadSize();

  // Don't write an empty element.
  if (size == 0)
    return true;

  // Don't write an invalid element.
  if (!Valid())
    return false;

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvColour, size))
    return false;

  if (matrix_coefficients_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvMatrixCoefficients,
                        static_cast<uint64>(matrix_coefficients_))) {
    return false;
  }
  if (bits_per_channel_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvBitsPerChannel,
                        static_cast<uint64>(bits_per_channel_))) {
    return false;
  }
  if (chroma_subsampling_horz_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvChromaSubsamplingHorz,
                        static_cast<uint64>(chroma_subsampling_horz_))) {
    return false;
  }
  if (chroma_subsampling_vert_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvChromaSubsamplingVert,
                        static_cast<uint64>(chroma_subsampling_vert_))) {
    return false;
  }

  if (cb_subsampling_horz_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvCbSubsamplingHorz,
                        static_cast<uint64>(cb_subsampling_horz_))) {
    return false;
  }
  if (cb_subsampling_vert_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvCbSubsamplingVert,
                        static_cast<uint64>(cb_subsampling_vert_))) {
    return false;
  }
  if (chroma_siting_horz_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvChromaSitingHorz,
                        static_cast<uint64>(chroma_siting_horz_))) {
    return false;
  }
  if (chroma_siting_vert_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvChromaSitingVert,
                        static_cast<uint64>(chroma_siting_vert_))) {
    return false;
  }
  if (range_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvRange,
                        static_cast<uint64>(range_))) {
    return false;
  }
  if (transfer_characteristics_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvTransferCharacteristics,
                        static_cast<uint64>(transfer_characteristics_))) {
    return false;
  }
  if (primaries_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvPrimaries,
                        static_cast<uint64>(primaries_))) {
    return false;
  }
  if (max_cll_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvMaxCLL,
                        static_cast<uint64>(max_cll_))) {
    return false;
  }
  if (max_fall_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvMaxFALL,
                        static_cast<uint64>(max_fall_))) {
    return false;
  }

  if (mastering_metadata_ && !mastering_metadata_->Write(writer))
    return false;

  return true;
}